

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UChar * __thiscall
icu_63::ResourceDataValue::getString(ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  UBool UVar1;
  UChar *s;
  UErrorCode *errorCode_local;
  int32_t *length_local;
  ResourceDataValue *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_local = (ResourceDataValue *)res_getString_63(this->pResData,this->res,length);
    if (this_local == (ResourceDataValue *)0x0) {
      *errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
  }
  else {
    this_local = (ResourceDataValue *)0x0;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar *ResourceDataValue::getString(int32_t &length, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    const UChar *s = res_getString(pResData, res, &length);
    if(s == NULL) {
        errorCode = U_RESOURCE_TYPE_MISMATCH;
    }
    return s;
}